

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test264.c
# Opt level: O3

int main(int argc,char **argv)

{
  h264_macroblock *phVar1;
  uint32_t *puVar2;
  int32_t (*paiVar3) [2];
  undefined4 *puVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  FILE *pFVar10;
  bitstream *pbVar11;
  h264_seqparm *phVar12;
  h264_picparm *phVar13;
  h264_slice *slice;
  h264_macroblock *phVar14;
  uint32_t uVar15;
  int32_t (*paaiVar16) [16] [16];
  int32_t (*paaiVar17) [8] [15];
  uint32_t uVar18;
  uint32_t (*pauVar19) [4];
  uint32_t *puVar20;
  uint uVar21;
  int iVar22;
  uint32_t *puVar23;
  uint32_t *puVar24;
  uint uVar25;
  int32_t (*paaiVar26) [16] [2];
  uint32_t uVar27;
  int32_t (*paaiVar28) [4] [64];
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  int32_t *piVar33;
  bool bVar34;
  uint uVar35;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint32_t val;
  uint32_t local_6c;
  int32_t (*local_68) [8] [15];
  int32_t *local_60;
  int32_t *local_58;
  int32_t (*local_50) [16] [16];
  FILE *local_48;
  h264_slice *local_40;
  bitstream *local_38;
  
  if (argc < 2) {
    pFVar10 = (FILE *)0x0;
  }
  else {
    pFVar10 = fopen(argv[1],"w");
    if (pFVar10 == (FILE *)0x0) {
      perror("fopen");
      return 1;
    }
  }
  pbVar11 = vs_new_encode(VS_H264);
  local_6c = 0xde;
  iVar9 = vs_start(pbVar11,&local_6c);
  iVar22 = 1;
  if (iVar9 == 0) {
    local_48 = pFVar10;
    local_38 = pbVar11;
    phVar12 = (h264_seqparm *)calloc(0xcd8,1);
    phVar13 = (h264_picparm *)calloc(0x8a8,1);
    slice = (h264_slice *)calloc(0xc48,1);
    phVar13->transform_8x8_mode_flag = 1;
    phVar13->entropy_coding_mode_flag = 1;
    slice->seqparm = phVar12;
    slice->picparm = phVar13;
    slice->pic_width_in_mbs = 8;
    slice->pic_size_in_mbs = 0xc0;
    slice->sliceqpy = 0x1a;
    slice->nal_unit_type = 1;
    slice->field_pic_flag = 1;
    slice->cabac_init_idc = 2;
    slice->chroma_array_type = 1;
    slice->num_ref_idx_l0_active_minus1 = 0x1f;
    slice->num_ref_idx_l1_active_minus1 = 0x1f;
    phVar14 = (h264_macroblock *)calloc(0x3774,0xc0);
    pbVar11 = local_38;
    slice->mbs = phVar14;
    auVar8 = _DAT_0010a0f0;
    auVar7 = _DAT_0010a0e0;
    auVar6 = _DAT_0010a0d0;
    local_60 = phVar14->mvd[0][0] + 1;
    paaiVar26 = phVar14->mvd;
    puVar23 = phVar14->rem_intra4x4_pred_mode;
    puVar24 = phVar14->pcm_sample_chroma;
    local_58 = phVar14->block_luma_ac[0][0] + 3;
    local_50 = phVar14->block_luma_4x4;
    paaiVar28 = phVar14->block_luma_8x8;
    uVar32 = 0;
    paaiVar17 = phVar14->block_chroma_ac;
    do {
      local_68 = paaiVar17;
      uVar25 = (uint)(uVar32 >> 2);
      phVar1 = phVar14 + uVar32;
      phVar14[uVar32].mb_field_decoding_flag = uVar25 & 1;
      uVar5 = (uint)uVar32;
      uVar21 = uVar5 * 3 + ((uVar5 * 3 & 0xffff) / 3 & 0xfffffff0) * -3;
      puVar20 = &phVar14[uVar32].coded_block_pattern;
      phVar14[uVar32].coded_block_pattern = uVar21 & 0xffff;
      phVar14[uVar32].transform_size_8x8_flag = uVar5 & 1;
      phVar14[uVar32].mb_qp_delta = (byte)((char)uVar32 + (char)((uVar5 & 0xff) / 5) * -5) - 2;
      if (uVar32 < 0x10) {
        phVar14[uVar32].mb_type = 0;
        uVar15 = 0;
LAB_00101966:
        lVar29 = -0x10;
        uVar35 = 0;
        uVar37 = 1;
        uVar38 = 2;
        uVar39 = 3;
        do {
          puVar2 = puVar23 + lVar29;
          *puVar2 = 0;
          puVar2[1] = uVar37 & 1;
          puVar2[2] = 0;
          puVar2[3] = uVar39 & 1;
          puVar2 = puVar23 + lVar29 + 0x10;
          *puVar2 = uVar35 >> 1;
          puVar2[1] = uVar37 >> 1;
          puVar2[2] = uVar38 >> 1;
          puVar2[3] = uVar39 >> 1;
          uVar35 = uVar35 + 4;
          uVar37 = uVar37 + 4;
          uVar38 = uVar38 + 4;
          uVar39 = uVar39 + 4;
          lVar29 = lVar29 + 4;
        } while (lVar29 != 0);
        puVar2 = phVar14[uVar32].prev_intra8x8_pred_mode_flag;
        puVar2[0] = 0;
        puVar2[1] = 1;
        puVar2[2] = 0;
        puVar2[3] = 1;
        puVar2 = phVar14[uVar32].rem_intra8x8_pred_mode;
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = 1;
        puVar2[3] = 1;
LAB_001019bb:
        if (uVar15 < 0x1b) {
LAB_00101a0f:
          phVar1->intra_chroma_pred_mode = uVar25 & 3;
        }
        if (uVar15 == 0x19) {
          phVar1->coded_block_pattern = 0x2f;
          phVar14[uVar32].transform_size_8x8_flag = 0;
          phVar14[uVar32].mb_qp_delta = 0;
          phVar14[uVar32].intra_chroma_pred_mode = 0;
          lVar29 = 0;
          do {
            if ((uVar32 & 1) != 0) {
              puVar24[lVar29] = (uint32_t)lVar29;
            }
            if ((uVar32 & 2) != 0) {
              puVar24[lVar29 + -0x100] = (uint32_t)lVar29;
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 != 0x100);
        }
        else {
          if ((uVar15 == 0x38) || (uVar15 == 0x20)) goto LAB_00101a2e;
          if (uVar15 - 0x19 < 0xffffffe8) {
LAB_00101cf8:
            if ((short)uVar21 == 0) {
              phVar1->mb_qp_delta = 0;
            }
            iVar9 = 0;
            uVar31 = 0;
            paaiVar16 = local_50;
            do {
              if ((*puVar20 >> ((uint)(uVar31 >> 2) & 0x1f) & 1) != 0) {
                lVar29 = 0;
                do {
                  if (uVar31 != 0) {
                    iVar22 = iVar9 + (int)lVar29;
                    (*paaiVar16)[0][lVar29] = iVar22;
                    *(int *)((long)(*paaiVar28)[0] +
                            lVar29 * 4 +
                            ((ulong)(((uint)uVar31 & 3) << 6) | (uVar31 & 0xfffffffffffffffc) << 6))
                         = iVar22;
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 0x10);
              }
              uVar31 = uVar31 + 1;
              iVar9 = iVar9 + 0x10;
              paaiVar16 = (int32_t (*) [16] [16])(*paaiVar16 + 1);
            } while (uVar31 != 0x10);
          }
          else {
            uVar25 = uVar15 * 4 - 4 & 0xfffffff0;
            uVar27 = uVar25 - 0x30;
            if (uVar15 - 1 < 0xc) {
              uVar27 = uVar25;
            }
            uVar18 = uVar27 + 0xf;
            if (uVar15 < 0xd) {
              uVar18 = uVar27;
            }
            *puVar20 = uVar18;
            phVar14[uVar32].transform_size_8x8_flag = 0;
            iVar9 = 0;
            uVar31 = 0;
            piVar33 = local_58;
            do {
              phVar14[uVar32].block_luma_dc[0][uVar31] = (uint)uVar31 | 0x100;
              if ((*puVar20 >> ((uint)(uVar31 >> 2) & 0x1f) & 1) != 0) {
                bVar34 = uVar31 != 0;
                lVar29 = 0;
                auVar41 = auVar6;
                auVar42 = auVar7;
                do {
                  auVar40 = auVar42 ^ auVar8;
                  auVar36 = auVar41 ^ auVar8;
                  iVar22 = (int)lVar29;
                  if ((auVar40._4_4_ == -0x80000000 && auVar40._0_4_ < -0x7ffffff1) && bVar34) {
                    piVar33[lVar29 + -3] = iVar9 + iVar22 + 1;
                  }
                  if ((auVar40._12_4_ == -0x80000000 && auVar40._8_4_ < -0x7ffffff1) && bVar34) {
                    piVar33[lVar29 + -2] = iVar9 + iVar22 + 2;
                  }
                  if ((auVar36._0_4_ < -0x7ffffff1 && auVar36._4_4_ == -0x80000000) && bVar34) {
                    piVar33[lVar29 + -1] = iVar9 + iVar22 + 3;
                  }
                  if ((auVar36._8_4_ < -0x7ffffff1 && auVar36._12_4_ == -0x80000000) && bVar34) {
                    piVar33[lVar29] = iVar9 + iVar22 + 4;
                  }
                  lVar29 = lVar29 + 4;
                  lVar30 = auVar42._8_8_;
                  auVar42._0_8_ = auVar42._0_8_ + 4;
                  auVar42._8_8_ = lVar30 + 4;
                  lVar30 = auVar41._8_8_;
                  auVar41._0_8_ = auVar41._0_8_ + 4;
                  auVar41._8_8_ = lVar30 + 4;
                } while (lVar29 != 0x10);
              }
              uVar31 = uVar31 + 1;
              iVar9 = iVar9 + 0x10;
              piVar33 = piVar33 + 0xf;
            } while (uVar31 != 0x10);
          }
          uVar25 = *puVar20;
          if ((uVar25 & 0x30) != 0) {
            puVar4 = (undefined4 *)((long)phVar1->block_chroma_dc[0] + (ulong)((uVar5 & 1) << 5));
            *puVar4 = 0xfffffff0;
            puVar4[1] = 0xfffffff1;
            puVar4[2] = 0xfffffff2;
            puVar4[3] = 0xfffffff3;
          }
          if ((uVar25 & 0x20) != 0) {
            paaiVar17 = local_68 + ((uint)(uVar32 >> 1) & 1);
            iVar9 = -0x1000;
            lVar29 = 0;
            do {
              lVar30 = 0;
              do {
                if (lVar29 != 1) {
                  (*paaiVar17)[0][lVar30] = iVar9 + (int)lVar30;
                }
                lVar30 = lVar30 + 1;
              } while (lVar30 != 0xf);
              lVar29 = lVar29 + 1;
              paaiVar17 = (int32_t (*) [8] [15])(*paaiVar17 + 1);
              iVar9 = iVar9 + 0x100;
            } while (lVar29 != 4);
          }
        }
      }
      else {
        if (uVar32 < 0x28) {
          uVar15 = uVar5 - 0xf;
          phVar14[uVar32].mb_type = uVar15;
LAB_001019d6:
          if ((uVar15 == 0x1a) || (uVar15 == 0)) goto LAB_00101966;
          goto LAB_001019bb;
        }
        if (uVar32 < 0x2c) {
          phVar14[uVar32].mb_type = 0x19;
          uVar15 = 0x19;
          goto LAB_00101a0f;
        }
        if (0x2f < uVar32) {
          if (uVar32 < 0x48) {
            uVar35 = uVar5 - 0x30 >> 3;
            uVar15 = uVar35 + 0x1b;
            phVar14[uVar32].mb_type = uVar15;
            pauVar19 = phVar14[uVar32].ref_idx;
            if (uVar5 - 0x30 < 8) {
              uVar27 = (uVar5 & 7) + 0xf;
              (*pauVar19)[0] = uVar27;
              phVar14[uVar32].ref_idx[0][1] = uVar27;
              phVar14[uVar32].ref_idx[0][2] = uVar27;
              phVar14[uVar32].ref_idx[0][3] = uVar27;
              iVar9 = -3 - (uVar5 & 7);
              lVar29 = 0;
              do {
                paiVar3 = *paaiVar26 + lVar29;
                (*paiVar3)[0] = iVar9;
                (*paiVar3)[1] = uVar5 & 3;
                paiVar3[1][0] = iVar9;
                paiVar3[1][1] = uVar5 & 3;
                lVar29 = lVar29 + 2;
              } while (lVar29 != 0x10);
            }
            else if (uVar35 == 1) {
              *(uint32_t *)((long)pauVar19 + 0) = 4;
              *(uint32_t *)((long)pauVar19 + 4) = 4;
              *(uint32_t *)((long)(phVar14[uVar32].ref_idx + 0) + 8) = 5;
              auVar41 = _DAT_0010a050;
              *(uint32_t *)((long)(phVar14[uVar32].ref_idx + 0) + 0xc) = 5;
              lVar29 = 0;
              uVar35 = 0;
              uVar37 = 1;
              do {
                paiVar3 = *paaiVar26 + lVar29;
                *paiVar3 = (int32_t  [2])(CONCAT44(-(uVar35 >> 3),uVar35 >> 3) | 0xc);
                paiVar3[2][0] = uVar37 >> 3 | 0xc;
                paiVar3[2][1] = -(uVar37 >> 3);
                lVar29 = lVar29 + 2;
                uVar35 = uVar35 + auVar41._0_4_;
                uVar37 = uVar37 + auVar41._4_4_;
              } while (lVar29 != 0x10);
            }
            else {
              *(uint32_t *)((long)pauVar19 + 0) = 2;
              *(uint32_t *)((long)pauVar19 + 4) = 3;
              *(uint32_t *)((long)(phVar14[uVar32].ref_idx + 0) + 8) = 2;
              *(uint32_t *)((long)(phVar14[uVar32].ref_idx + 0) + 0xc) = 3;
              lVar29 = 0;
              uVar35 = 0;
              uVar37 = 1;
              do {
                paiVar3 = *paaiVar26 + lVar29;
                (*paiVar3)[0] = uVar35 >> 2 | 6;
                (*paiVar3)[1] = -(uVar35 >> 2 & 1);
                paiVar3[1][0] = uVar37 >> 2 | 6;
                paiVar3[1][1] = -(uVar37 >> 2 & 1);
                lVar29 = lVar29 + 2;
                uVar35 = uVar35 + 2;
                uVar37 = uVar37 + 2;
              } while (lVar29 != 0x10);
            }
            goto LAB_001019d6;
          }
          phVar14[uVar32].mb_type = 0x1e;
          phVar14[uVar32].transform_size_8x8_flag = 0;
          lVar29 = 0;
          piVar33 = local_60;
          do {
            phVar1->sub_mb_type[lVar29] = (uint32_t)lVar29;
            lVar30 = lVar29 + 1;
            phVar14[uVar32].ref_idx[0][lVar29] = (uint32_t)lVar30;
            uVar25 = (&DAT_0010a130)[lVar29];
            iVar9 = (uint32_t)lVar29 * 4;
            lVar29 = 0;
            do {
              uVar35 = uVar25 & (uint)lVar29;
              piVar33[lVar29 * 2 + -1] = uVar35 + iVar9 + 0x10;
              piVar33[lVar29 * 2] = uVar35 + iVar9 + -0x20;
              lVar29 = lVar29 + 1;
            } while (lVar29 != 4);
            piVar33 = piVar33 + 8;
            lVar29 = lVar30;
          } while (lVar30 != 4);
          goto LAB_00101cf8;
        }
        phVar14[uVar32].mb_type = 0x20;
LAB_00101a2e:
        *puVar20 = 0;
        phVar14[uVar32].transform_size_8x8_flag = 0;
        phVar14[uVar32].mb_qp_delta = 0;
        phVar14[uVar32].intra_chroma_pred_mode = 0;
      }
      phVar1->mb_field_decoding_flag = 1;
      uVar32 = uVar32 + 1;
      local_60 = local_60 + 0xddd;
      paaiVar26 = (int32_t (*) [16] [2])((long)(paaiVar26 + 0x6e) + 0x74);
      puVar23 = puVar23 + 0xddd;
      puVar24 = puVar24 + 0xddd;
      local_58 = local_58 + 0xddd;
      local_50 = (int32_t (*) [16] [16])((long)(local_50 + 0xd) + 0x374);
      paaiVar28 = (int32_t (*) [4] [64])((long)(paaiVar28 + 0xd) + 0x374);
      paaiVar17 = (int32_t (*) [8] [15])((long)(local_68 + 0x1d) + 0x114);
    } while (uVar32 != 0x60);
    slice->last_mb_in_slice = 0x5f;
    local_40 = slice;
    iVar9 = h264_slice_data(local_38,slice);
    iVar22 = 1;
    if (iVar9 == 0) {
      if (local_48 != (FILE *)0x0) {
        fwrite(pbVar11->bytes,(long)pbVar11->bytesnum,1,local_48);
      }
      pbVar11 = vs_new_decode(VS_H264,pbVar11->bytes,pbVar11->bytesnum);
      iVar9 = vs_start(pbVar11,&local_6c);
      if (iVar9 == 0) {
        if (local_6c == 0xde) {
          iVar9 = h264_slice_data(pbVar11,slice);
          h264_print_slice_data(slice);
          if (iVar9 == 0) {
            main_cold_2();
            iVar22 = 0;
          }
        }
        else {
          main_cold_1();
        }
      }
    }
  }
  return iVar22;
}

Assistant:

int main(int argc, char **argv) {
	FILE *out = 0;
	if (argc >= 2) {
		out = fopen(argv[1], "w");
		if (!out) {
			perror("fopen");
			return 1;
		}
	}
	struct bitstream *str = vs_new_encode(VS_H264);
	uint32_t val;
	val = 0xde;
	if (vs_start(str, &val))
		return 1;

	struct h264_seqparm *seqparm = calloc(sizeof *seqparm, 1);
	struct h264_picparm *picparm = calloc(sizeof *picparm, 1);
	struct h264_slice *slice = calloc(sizeof *slice, 1);
	seqparm->frame_mbs_only_flag = 0;
	seqparm->direct_8x8_inference_flag = 0;
	picparm->num_slice_groups_minus1 = 0;
	picparm->constrained_intra_pred_flag = 0;
	picparm->transform_8x8_mode_flag = 1;
	picparm->entropy_coding_mode_flag = 1;
	slice->seqparm = seqparm;
	slice->picparm = picparm;
	slice->sliceqpy = 26;
	slice->pic_width_in_mbs = 8;
	slice->pic_size_in_mbs = slice->pic_width_in_mbs * 24;
	slice->first_mb_in_slice = 0;
	slice->nal_unit_type = 1;
	slice->slice_type = H264_SLICE_TYPE_P;
	slice->mbaff_frame_flag = 0;
	slice->field_pic_flag = 1;
	slice->cabac_init_idc = 2;
	slice->chroma_array_type = 1;
	slice->num_ref_idx_l0_active_minus1 = 31;
	slice->num_ref_idx_l1_active_minus1 = 31;
	slice->bit_depth_luma_minus8 = 0;
	slice->bit_depth_chroma_minus8 = 0;
	slice->mbs = calloc(sizeof *slice->mbs, slice->pic_size_in_mbs);
	int i, j, k;
	for (i = 0; i < 96; i++) {
		slice->mbs[i].mb_field_decoding_flag = i >> 2 & 1;
		slice->mbs[i].coded_block_pattern = i * 3 % 48;
		slice->mbs[i].transform_size_8x8_flag = i& 1;
		slice->mbs[i].mb_qp_delta = (i%5) - 2;
		if (i < 16) {
			slice->mbs[i].mb_type = 0;
		} else if (i < 40) {
			slice->mbs[i].mb_type = 1 + (i- 16);
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_P) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_SKIP;
			} else if (i < 72) {
				int x = (i - 48)/8;
				slice->mbs[i].mb_type = H264_MB_TYPE_P_L0_16X16 + x;
				if (x == 0) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 15 + (i & 7);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = -((i & 7) + 3);
						slice->mbs[i].mvd[0][j][1] = (i&3);
					}
				} else if (x == 1) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 4 + (j >> 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 12 + (j >> 3);
						slice->mbs[i].mvd[0][j][1] = -(j >> 3);
					}
				} else if (x == 2) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 2 + (j & 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 6 + (j>>2 & 1);
						slice->mbs[i].mvd[0][j][1] = -(j>>2 & 1);
					}
				}
			} else {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_8X8;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 4; j++) {
					slice->mbs[i].sub_mb_type[j] = j;
					slice->mbs[i].ref_idx[0][j] = j+1;
					int tt[4] = { 0, 2, 1, 3};
					for (k = 0; k < 4; k++) {
						int kk = j * 4 + (k & j[tt]);
						slice->mbs[i].mvd[0][j*4+k][0] = 16+kk;
						slice->mbs[i].mvd[0][j*4+k][1] = kk - 32;;
					}
				}
			}
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_B) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else if (i < 72) {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			}
		} else {
			slice->mbs[i].mb_type = H264_MB_TYPE_I_PCM;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_I_NXN || slice->mbs[i].mb_type == H264_MB_TYPE_SI) {
			for (j = 0; j < 16; j++) {
				slice->mbs[i].prev_intra4x4_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra4x4_pred_mode[j] = j >> 1;
			}
			for (j = 0; j < 4; j++) {
				slice->mbs[i].prev_intra8x8_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra8x8_pred_mode[j] = j >> 1;
			}
		}
		if (slice->mbs[i].mb_type < H264_MB_TYPE_P_BASE) {
			slice->mbs[i].intra_chroma_pred_mode = i >> 2 & 3;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_P_SKIP || slice->mbs[i].mb_type == H264_MB_TYPE_B_SKIP) {
			slice->mbs[i].mb_field_decoding_flag = 0;
			slice->mbs[i].coded_block_pattern = 0;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
		} else if (slice->mbs[i].mb_type == H264_MB_TYPE_I_PCM) {
			slice->mbs[i].coded_block_pattern = 0x2f;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
			for (j = 0; j < 256; j++) {
				if (i & 1)
					slice->mbs[i].pcm_sample_chroma[j] = j;
				if (i & 2)
					slice->mbs[i].pcm_sample_luma[j] = j;
			}
		} else {
			if (h264_is_intra_16x16_mb_type(slice->mbs[i].mb_type)) {
				int mbt = slice->mbs[i].mb_type;
				int infer_cbp = (((mbt - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
				if (mbt >= H264_MB_TYPE_I_16X16_0_0_1)
					infer_cbp |= 0xf;
				slice->mbs[i].coded_block_pattern = infer_cbp;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 16; j++) {
					slice->mbs[i].block_luma_dc[0][j] = 0x100 + j;
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 15; k++) {
							if (j) {
								slice->mbs[i].block_luma_ac[0][j][k] = j * 16 + k + 1;
							}
						}
					}
				}
			} else {
				if (!slice->mbs[i].coded_block_pattern)
					slice->mbs[i].mb_qp_delta = 0;
				for (j = 0; j < 16; j++) {
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 16; k++) {
							if (j) {
								slice->mbs[i].block_luma_4x4[0][j][k] = j * 16 + k;
								slice->mbs[i].block_luma_8x8[0][j>>2][(j&3)*16+k] = j*16 + k;
							}
						}
					}
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x30) {
				for (k = 0; k < 4; k++) {
					slice->mbs[i].block_chroma_dc[i&1][k] = -0x10 + k;
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x20) {
				for (j = 0; j < 4; j++) {
					for (k = 0; k < 15; k++) {
						if (j != 1)
							slice->mbs[i].block_chroma_ac[i>>1&1][j][k] = k - 0x1000 + j * 0x100;
					}
				}
			}
		}
		if (!slice->mbaff_frame_flag)
			slice->mbs[i].mb_field_decoding_flag = slice->field_pic_flag;
	}
	slice->last_mb_in_slice = i - 1;
	
	if (h264_slice_data(str, slice)) return 1;

	if (out)
		fwrite(str->bytes, str->bytesnum, 1, out);

	struct bitstream *nstr = vs_new_decode(VS_H264, str->bytes, str->bytesnum);
	if (vs_start(nstr, &val))
		return 1;
	if (val != 0xde) {
		fprintf (stderr, "Fail 1\n");
		return 1;
	}
	if (h264_slice_data(nstr, slice)) {
		h264_print_slice_data(slice);
		return 1;
	}
	h264_print_slice_data(slice);

	fprintf (stderr, "All ok!\n");

	return 0;
}